

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_quads_to_grids
          (Ref<embree::SceneGraph::QuadMeshNode> *qmesh,uint resX,uint resY)

{
  ulong uVar1;
  size_t sVar2;
  undefined8 uVar3;
  ulong uVar4;
  _func_int **pp_Var5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  unsigned_long *puVar9;
  Vec3fa *pVVar10;
  uint in_ECX;
  uint in_EDX;
  long *in_RSI;
  Node *in_RDI;
  Vertex vtx;
  float v;
  float u;
  uint x;
  uint y;
  Vertex v11;
  Vertex v10;
  Vertex v01;
  Vertex v00;
  size_t t;
  uint lineStride;
  uint startVtx;
  size_t i;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *quads;
  Ref<embree::SceneGraph::GridMeshNode> gmesh;
  size_t timeSteps;
  Vec3fa v_1;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced;
  value_type *in_stack_fffffffffffff4f8;
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  *in_stack_fffffffffffff500;
  size_t in_stack_fffffffffffff508;
  size_t in_stack_fffffffffffff578;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff580;
  GridMeshNode *in_stack_fffffffffffff588;
  BBox1f in_stack_fffffffffffff590;
  Grid local_9d4;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float local_914;
  uint local_910;
  uint local_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  size_type local_8c0;
  uint local_8b8;
  uint local_8b4;
  ulong local_8b0;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *local_8a8;
  undefined1 local_899;
  undefined8 local_898;
  long *local_880;
  _func_int **local_878;
  size_type local_870;
  uint local_868;
  uint local_864;
  reference local_850;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 *local_7f8;
  reference local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  undefined8 *local_7c8;
  undefined8 *local_7c0;
  undefined8 *local_7b8;
  undefined8 *local_7b0;
  undefined8 *local_7a8;
  _func_int ***local_7a0;
  _func_int ***local_798;
  _func_int ***local_790;
  _func_int ***local_788;
  ulong local_778;
  reference local_770;
  ulong local_768;
  reference local_760;
  ulong local_758;
  reference local_750;
  ulong local_748;
  reference local_740;
  long *local_738;
  long **local_730;
  long **local_728;
  _func_int **local_718;
  _func_int ***local_710;
  undefined8 *local_708;
  Vec3fa *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  Vec3fa *local_6e8;
  undefined8 *local_6e0;
  Vec3fa *local_6d8;
  undefined8 *local_6d0;
  Vec3fa *local_6c8;
  undefined8 *local_6c0;
  Vec3fa *local_6b8;
  undefined8 *local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_68c;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 local_678;
  undefined8 uStack_670;
  float local_65c;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  float local_62c;
  undefined8 *local_628;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  float local_5fc;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float local_5cc;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float local_59c;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_56c;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  float local_53c;
  undefined8 *local_538;
  undefined8 *local_530;
  _func_int ***local_528;
  _func_int **local_518;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 *local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 *local_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 *local_1d0;
  float local_1c4;
  undefined8 *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  undefined8 *puStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  undefined8 *puStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  undefined8 *puStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  undefined8 *puStack_140;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  undefined8 *puStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  undefined8 *puStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  undefined8 *puStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  ulong local_b8;
  ulong local_b0;
  Vec3fa *local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  reference local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  Vec3fa *local_68;
  Vec3fa *local_60;
  size_t local_58;
  reference local_50;
  size_t local_48;
  Vec3fa *local_40;
  reference local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  reference local_10;
  size_t local_8;
  
  local_868 = in_ECX;
  local_864 = in_EDX;
  local_870 = std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)(*in_RSI + 0x70));
  pp_Var5 = (_func_int **)::operator_new(0xa8);
  local_899 = 1;
  local_738 = (long *)(*in_RSI + 0xd0);
  local_730 = &local_880;
  local_880 = (long *)*local_738;
  if (local_880 != (long *)0x0) {
    (**(code **)(*local_880 + 0x10))();
  }
  local_898 = *(undefined8 *)(*in_RSI + 0x68);
  GridMeshNode::GridMeshNode
            (in_stack_fffffffffffff588,in_stack_fffffffffffff580,in_stack_fffffffffffff590,
             in_stack_fffffffffffff578);
  local_899 = 0;
  local_710 = &local_878;
  local_718 = pp_Var5;
  local_878 = pp_Var5;
  if (pp_Var5 != (_func_int **)0x0) {
    (**(code **)(*pp_Var5 + 0x10))();
  }
  local_728 = &local_880;
  if (local_880 != (long *)0x0) {
    (**(code **)(*local_880 + 0x18))();
  }
  local_8a8 = (vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               *)(*in_RSI + 0xb8);
  for (local_8b0 = 0; uVar1 = local_8b0,
      sVar6 = std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::size(local_8a8), uVar1 < sVar6; local_8b0 = local_8b0 + 1) {
    local_790 = &local_878;
    local_850 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_878 + 0xe),0);
    local_8b4 = (uint)local_850->size_active;
    local_8b8 = local_864;
    for (local_8c0 = 0; local_8c0 < local_870; local_8c0 = local_8c0 + 1) {
      pvVar7 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(*in_RSI + 0x70),local_8c0);
      pvVar8 = std::
               vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ::operator[](local_8a8,local_8b0);
      local_748 = (ulong)pvVar8->v0;
      local_6e8 = pvVar7->items + local_748;
      local_6e0 = &local_8d8;
      local_8d8 = *(undefined8 *)&local_6e8->field_0;
      uStack_8d0 = *(undefined8 *)((long)&local_6e8->field_0 + 8);
      local_740 = pvVar7;
      pvVar7 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(*in_RSI + 0x70),local_8c0);
      pvVar8 = std::
               vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ::operator[](local_8a8,local_8b0);
      local_758 = (ulong)pvVar8->v1;
      local_6d8 = pvVar7->items + local_758;
      local_6d0 = &local_8e8;
      local_8e8 = *(undefined8 *)&local_6d8->field_0;
      uStack_8e0 = *(undefined8 *)((long)&local_6d8->field_0 + 8);
      local_750 = pvVar7;
      pvVar7 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(*in_RSI + 0x70),local_8c0);
      pvVar8 = std::
               vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ::operator[](local_8a8,local_8b0);
      local_768 = (ulong)pvVar8->v3;
      local_6c8 = pvVar7->items + local_768;
      local_6c0 = &local_8f8;
      local_8f8 = *(undefined8 *)&local_6c8->field_0;
      uStack_8f0 = *(undefined8 *)((long)&local_6c8->field_0 + 8);
      local_760 = pvVar7;
      pvVar7 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(*in_RSI + 0x70),local_8c0);
      pvVar8 = std::
               vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
               ::operator[](local_8a8,local_8b0);
      local_778 = (ulong)pvVar8->v2;
      local_6b8 = pvVar7->items + local_778;
      local_6b0 = &local_908;
      local_908 = *(undefined8 *)&local_6b8->field_0;
      uStack_900 = *(undefined8 *)((long)&local_6b8->field_0 + 8);
      local_770 = pvVar7;
      for (local_90c = 0; local_90c < local_868; local_90c = local_90c + 1) {
        for (local_910 = 0; local_910 < local_864; local_910 = local_910 + 1) {
          local_914 = (float)local_910 / (float)(local_864 - 1);
          local_918 = (float)local_90c / (float)(local_868 - 1);
          local_53c = 1.0 - local_914;
          local_530 = &local_968;
          local_538 = &local_8d8;
          local_1c0 = &local_558;
          local_438 = CONCAT44(local_53c,local_53c);
          uStack_430 = CONCAT44(local_53c,local_53c);
          local_440 = &local_968;
          local_450 = &local_558;
          local_428._0_4_ = (float)local_8d8;
          local_428._4_4_ = (float)((ulong)local_8d8 >> 0x20);
          uStack_420._0_4_ = (float)uStack_8d0;
          uStack_420._4_4_ = (float)((ulong)uStack_8d0 >> 0x20);
          local_418 = (float)local_428 * local_53c;
          fStack_414 = local_428._4_4_ * local_53c;
          fStack_410 = (float)uStack_420 * local_53c;
          fStack_40c = uStack_420._4_4_ * local_53c;
          local_408 = &local_968;
          local_3d8 = CONCAT44(fStack_414,local_418);
          uStack_3d0 = CONCAT44(fStack_40c,fStack_410);
          local_56c = 1.0 - local_918;
          local_560 = &local_958;
          local_568 = &local_968;
          puStack_1a0 = &local_588;
          local_3e8 = CONCAT44(local_56c,local_56c);
          uStack_3e0 = CONCAT44(local_56c,local_56c);
          local_3f0 = &local_958;
          local_400 = &local_588;
          local_3c8 = local_418 * local_56c;
          fStack_3c4 = fStack_414 * local_56c;
          fStack_3c0 = fStack_410 * local_56c;
          fStack_3bc = fStack_40c * local_56c;
          local_3b8 = &local_958;
          local_4f8 = CONCAT44(fStack_3c4,local_3c8);
          uStack_4f0 = CONCAT44(fStack_3bc,fStack_3c0);
          local_590 = &local_988;
          local_598 = &local_8e8;
          puStack_180 = &local_5b8;
          local_398 = CONCAT44(local_914,local_914);
          uStack_390 = CONCAT44(local_914,local_914);
          local_3a0 = &local_988;
          local_3b0 = &local_5b8;
          local_388._0_4_ = (float)local_8e8;
          local_388._4_4_ = (float)((ulong)local_8e8 >> 0x20);
          uStack_380._0_4_ = (float)uStack_8e0;
          uStack_380._4_4_ = (float)((ulong)uStack_8e0 >> 0x20);
          local_378 = (float)local_388 * local_914;
          fStack_374 = local_388._4_4_ * local_914;
          fStack_370 = (float)uStack_380 * local_914;
          fStack_36c = uStack_380._4_4_ * local_914;
          local_368 = &local_988;
          local_338 = CONCAT44(fStack_374,local_378);
          uStack_330 = CONCAT44(fStack_36c,fStack_370);
          local_5cc = 1.0 - local_918;
          local_5c0 = &local_978;
          local_5c8 = &local_988;
          puStack_160 = &local_5e8;
          local_348 = CONCAT44(local_5cc,local_5cc);
          uStack_340 = CONCAT44(local_5cc,local_5cc);
          local_350 = &local_978;
          local_360 = &local_5e8;
          local_328 = local_378 * local_5cc;
          fStack_324 = fStack_374 * local_5cc;
          fStack_320 = fStack_370 * local_5cc;
          fStack_31c = fStack_36c * local_5cc;
          local_318 = &local_978;
          local_508 = CONCAT44(fStack_324,local_328);
          uStack_500 = CONCAT44(fStack_31c,fStack_320);
          local_7a8 = &local_948;
          local_7b0 = &local_958;
          local_7b8 = &local_978;
          local_4a8 = local_3c8 + local_328;
          fStack_4a4 = fStack_3c4 + fStack_324;
          fStack_4a0 = fStack_3c0 + fStack_320;
          fStack_49c = fStack_3bc + fStack_31c;
          local_490 = &local_948;
          local_4d8 = CONCAT44(fStack_4a4,local_4a8);
          uStack_4d0 = CONCAT44(fStack_49c,fStack_4a0);
          local_5fc = 1.0 - local_914;
          local_5f0 = &local_9a8;
          local_5f8 = &local_8f8;
          puStack_140 = &local_618;
          local_2f8 = CONCAT44(local_5fc,local_5fc);
          uStack_2f0 = CONCAT44(local_5fc,local_5fc);
          local_300 = &local_9a8;
          local_310 = &local_618;
          local_2e8._0_4_ = (float)local_8f8;
          local_2e8._4_4_ = (float)((ulong)local_8f8 >> 0x20);
          uStack_2e0._0_4_ = (float)uStack_8f0;
          uStack_2e0._4_4_ = (float)((ulong)uStack_8f0 >> 0x20);
          local_2d8 = (float)local_2e8 * local_5fc;
          fStack_2d4 = local_2e8._4_4_ * local_5fc;
          fStack_2d0 = (float)uStack_2e0 * local_5fc;
          fStack_2cc = uStack_2e0._4_4_ * local_5fc;
          local_2c8 = &local_9a8;
          local_298 = CONCAT44(fStack_2d4,local_2d8);
          uStack_290 = CONCAT44(fStack_2cc,fStack_2d0);
          local_620 = &local_998;
          local_628 = &local_9a8;
          puStack_120 = &local_648;
          local_2a8 = CONCAT44(local_918,local_918);
          uStack_2a0 = CONCAT44(local_918,local_918);
          local_2b0 = &local_998;
          local_2c0 = &local_648;
          local_288 = local_2d8 * local_918;
          fStack_284 = fStack_2d4 * local_918;
          fStack_280 = fStack_2d0 * local_918;
          fStack_27c = fStack_2cc * local_918;
          local_278 = &local_998;
          local_4e8 = CONCAT44(fStack_284,local_288);
          uStack_4e0 = CONCAT44(fStack_27c,fStack_280);
          local_7c0 = &local_938;
          local_7c8 = &local_948;
          local_7d0 = &local_998;
          local_488 = local_4a8 + local_288;
          fStack_484 = fStack_4a4 + fStack_284;
          fStack_480 = fStack_4a0 + fStack_280;
          fStack_47c = fStack_49c + fStack_27c;
          local_470 = &local_938;
          local_4b8 = CONCAT44(fStack_484,local_488);
          uStack_4b0 = CONCAT44(fStack_47c,fStack_480);
          local_650 = &local_9c8;
          local_658 = &local_908;
          puStack_100 = &local_678;
          local_258 = CONCAT44(local_914,local_914);
          uStack_250 = CONCAT44(local_914,local_914);
          local_260 = &local_9c8;
          local_270 = &local_678;
          local_248._0_4_ = (float)local_908;
          local_248._4_4_ = (float)((ulong)local_908 >> 0x20);
          uStack_240._0_4_ = (float)uStack_900;
          uStack_240._4_4_ = (float)((ulong)uStack_900 >> 0x20);
          local_238 = (float)local_248 * local_914;
          fStack_234 = local_248._4_4_ * local_914;
          fStack_230 = (float)uStack_240 * local_914;
          fStack_22c = uStack_240._4_4_ * local_914;
          local_228 = &local_9c8;
          local_1f8 = CONCAT44(fStack_234,local_238);
          uStack_1f0 = CONCAT44(fStack_22c,fStack_230);
          local_680 = &local_9b8;
          local_688 = &local_9c8;
          puStack_e0 = &local_6a8;
          local_208 = CONCAT44(local_918,local_918);
          uStack_200 = CONCAT44(local_918,local_918);
          local_210 = &local_9b8;
          local_220 = &local_6a8;
          local_1e8 = local_238 * local_918;
          fStack_1e4 = fStack_234 * local_918;
          fStack_1e0 = fStack_230 * local_918;
          fStack_1dc = fStack_22c * local_918;
          local_1d0 = &local_9b8;
          local_4c8 = CONCAT44(fStack_1e4,local_1e8);
          uStack_4c0 = CONCAT44(fStack_1dc,fStack_1e0);
          local_7d8 = &local_928;
          local_7e0 = &local_938;
          local_7e8 = &local_9b8;
          local_468 = local_488 + local_1e8;
          fStack_464 = fStack_484 + fStack_1e4;
          fStack_460 = fStack_480 + fStack_1e0;
          fStack_45c = fStack_47c + fStack_1dc;
          local_458 = &local_928;
          local_928 = CONCAT44(fStack_464,local_468);
          uStack_920 = CONCAT44(fStack_45c,fStack_460);
          local_798 = &local_878;
          local_68c = local_918;
          local_65c = local_914;
          local_62c = local_918;
          local_59c = local_914;
          local_448 = local_538;
          local_428 = local_8d8;
          uStack_420 = uStack_8d0;
          local_3f8 = local_568;
          local_3a8 = local_598;
          local_388 = local_8e8;
          uStack_380 = uStack_8e0;
          local_358 = local_5c8;
          local_308 = local_5f8;
          local_2e8 = local_8f8;
          uStack_2e0 = uStack_8f0;
          local_2b8 = local_628;
          local_268 = local_658;
          local_248 = local_908;
          uStack_240 = uStack_900;
          local_218 = local_688;
          local_1c4 = local_53c;
          local_1b8 = local_53c;
          fStack_1b4 = local_53c;
          fStack_1b0 = local_53c;
          fStack_1ac = local_53c;
          local_1a8 = local_53c;
          fStack_1a4 = local_56c;
          local_198 = local_56c;
          fStack_194 = local_56c;
          fStack_190 = local_56c;
          fStack_18c = local_56c;
          local_188 = local_56c;
          fStack_184 = local_914;
          local_178 = local_914;
          fStack_174 = local_914;
          fStack_170 = local_914;
          fStack_16c = local_914;
          local_168 = local_914;
          fStack_164 = local_5cc;
          local_158 = local_5cc;
          fStack_154 = local_5cc;
          fStack_150 = local_5cc;
          fStack_14c = local_5cc;
          local_148 = local_5cc;
          fStack_144 = local_5fc;
          local_138 = local_5fc;
          fStack_134 = local_5fc;
          fStack_130 = local_5fc;
          fStack_12c = local_5fc;
          local_128 = local_5fc;
          fStack_124 = local_918;
          local_118 = local_918;
          fStack_114 = local_918;
          fStack_110 = local_918;
          fStack_10c = local_918;
          local_108 = local_918;
          fStack_104 = local_914;
          local_f8 = local_914;
          fStack_f4 = local_914;
          fStack_f0 = local_914;
          fStack_ec = local_914;
          local_e8 = local_914;
          fStack_e4 = local_918;
          local_d8 = local_918;
          fStack_d4 = local_918;
          fStack_d0 = local_918;
          fStack_cc = local_918;
          local_c8 = local_918;
          local_9c8 = local_1f8;
          uStack_9c0 = uStack_1f0;
          local_9b8 = local_4c8;
          uStack_9b0 = uStack_4c0;
          local_9a8 = local_298;
          uStack_9a0 = uStack_290;
          local_998 = local_4e8;
          uStack_990 = uStack_4e0;
          local_988 = local_338;
          uStack_980 = uStack_330;
          local_978 = local_508;
          uStack_970 = uStack_500;
          local_968 = local_3d8;
          uStack_960 = uStack_3d0;
          local_958 = local_4f8;
          uStack_950 = uStack_4f0;
          local_948 = local_4d8;
          uStack_940 = uStack_4d0;
          local_938 = local_4b8;
          uStack_930 = uStack_4b0;
          local_6a8 = local_208;
          uStack_6a0 = uStack_200;
          local_678 = local_258;
          uStack_670 = uStack_250;
          local_648 = local_2a8;
          uStack_640 = uStack_2a0;
          local_618 = local_2f8;
          uStack_610 = uStack_2f0;
          local_5e8 = local_348;
          uStack_5e0 = uStack_340;
          local_5b8 = local_398;
          uStack_5b0 = uStack_390;
          local_588 = local_3e8;
          uStack_580 = uStack_3e0;
          local_558 = local_438;
          uStack_550 = uStack_430;
          pvVar7 = std::
                   vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)(local_878 + 0xe),local_8c0);
          local_7f8 = &local_928;
          local_6f0 = &local_808;
          local_808 = local_928;
          uStack_800 = uStack_920;
          uVar1 = pvVar7->size_active;
          local_18 = pvVar7->size_active + 1;
          local_7f0 = pvVar7;
          local_6f8 = local_7f8;
          local_10 = pvVar7;
          if (pvVar7->size_alloced < local_18) {
            sVar2 = local_18;
            if (pvVar7->size_alloced != 0) {
              local_20 = pvVar7->size_alloced;
              while (local_20 < local_18) {
                local_30[1] = 1;
                local_30[0] = local_20 << 1;
                puVar9 = std::max<unsigned_long>(local_30 + 1,local_30);
                local_20 = *puVar9;
              }
              local_8 = local_20;
              sVar2 = local_8;
            }
          }
          else {
            sVar2 = pvVar7->size_alloced;
          }
          local_8 = sVar2;
          local_90 = local_8;
          uVar4 = uVar1;
          if (uVar1 < pvVar7->size_active) {
            while (local_98 = uVar4, local_98 < pvVar7->size_active) {
              uVar4 = local_98 + 1;
            }
            pvVar7->size_active = uVar1;
          }
          local_88 = uVar1;
          local_80 = pvVar7;
          if (local_8 == pvVar7->size_alloced) {
            for (local_a0 = pvVar7->size_active; local_a0 < uVar1; local_a0 = local_a0 + 1) {
              local_68 = pvVar7->items + local_a0;
            }
            pvVar7->size_active = uVar1;
          }
          else {
            local_a8 = pvVar7->items;
            local_58 = local_8;
            local_50 = pvVar7;
            pVVar10 = (Vec3fa *)
                      alignedMalloc(in_stack_fffffffffffff508,(size_t)in_stack_fffffffffffff500);
            pvVar7->items = pVVar10;
            for (local_b0 = 0; local_b0 < pvVar7->size_active; local_b0 = local_b0 + 1) {
              local_70 = pvVar7->items + local_b0;
              local_78 = local_a8 + local_b0;
              uVar3 = *(undefined8 *)((long)&local_78->field_0 + 8);
              *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
              *(undefined8 *)((long)&local_70->field_0 + 8) = uVar3;
            }
            for (local_b8 = pvVar7->size_active; local_b8 < local_88; local_b8 = local_b8 + 1) {
              local_60 = pvVar7->items + local_b8;
            }
            local_48 = pvVar7->size_alloced;
            local_40 = local_a8;
            local_38 = pvVar7;
            alignedFree(in_stack_fffffffffffff4f8);
            pvVar7->size_active = local_88;
            pvVar7->size_alloced = local_90;
          }
          sVar2 = pvVar7->size_active;
          pvVar7->size_active = sVar2 + 1;
          local_700 = pvVar7->items + sVar2;
          local_708 = &local_808;
          *(undefined8 *)&local_700->field_0 = local_808;
          *(undefined8 *)((long)&local_700->field_0 + 8) = uStack_800;
        }
      }
    }
    local_7a0 = &local_878;
    GridMeshNode::Grid::Grid(&local_9d4,local_8b4,local_8b8,local_864,local_868);
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::push_back(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  }
  local_528 = &local_878;
  local_518 = local_878;
  (in_RDI->super_RefCount)._vptr_RefCount = local_878;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_788 = &local_878;
  if (local_878 != (_func_int **)0x0) {
    (**(code **)(*local_878 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_grids ( Ref<SceneGraph::QuadMeshNode> qmesh , const unsigned int resX, const unsigned int resY )
  {
    const size_t timeSteps = qmesh->positions.size();
    Ref<SceneGraph::GridMeshNode> gmesh = new SceneGraph::GridMeshNode(qmesh->material,qmesh->time_range,timeSteps);
    std::vector<SceneGraph::QuadMeshNode::Quad>& quads = qmesh->quads;

    for (size_t i=0;i<quads.size();i++)
    {
      const unsigned int startVtx = (unsigned int) gmesh->positions[0].size();
      const unsigned int lineStride = resX;
      for (size_t t=0;t<timeSteps;t++)
      {
        const SceneGraph::GridMeshNode::Vertex v00 = qmesh->positions[t][quads[i].v0];
        const SceneGraph::GridMeshNode::Vertex v01 = qmesh->positions[t][quads[i].v1];
        const SceneGraph::GridMeshNode::Vertex v10 = qmesh->positions[t][quads[i].v3];
        const SceneGraph::GridMeshNode::Vertex v11 = qmesh->positions[t][quads[i].v2];
        for (unsigned int y=0; y<resY; y++)
        {
          for (unsigned int x=0; x<resX; x++)
          {
            const float u = (float)x / (resX-1);
            const float v = (float)y / (resY-1);
            const SceneGraph::GridMeshNode::Vertex vtx = v00 * (1.0f-u) * (1.0f-v) + v01 * u * (1.0f-v) + v10 * (1.0f-u) * v + v11 * u * v;
            gmesh->positions[t].push_back( vtx );
          }
        }
      }
      assert(startVtx + resX * resY == gmesh->positions[0].size());
      gmesh->grids.push_back(SceneGraph::GridMeshNode::Grid(startVtx,lineStride,resX,resY));
    }
    return gmesh.dynamicCast<SceneGraph::Node>();
  }